

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_get.c
# Opt level: O2

int buffer_feed(buffer *s)

{
  uint n;
  uint uVar1;
  
  n = s->p;
  if (n == 0) {
    n = oneread(s->op,s->fd,s->x,s->n);
    if (0 < (int)n) {
      s->p = n;
      uVar1 = s->n - n;
      s->n = uVar1;
      if (uVar1 != 0) {
        byte_copyr(s->x + uVar1,n,s->x);
      }
    }
  }
  return n;
}

Assistant:

int buffer_feed(buffer *s)
{
  int r;

  if (s->p) return s->p;
  r = oneread(s->op,s->fd,s->x,s->n);
  if (r <= 0) return r;
  s->p = r;
  s->n -= r;
  if (s->n > 0) byte_copyr(s->x + s->n,r,s->x);
  return r;
}